

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curve25519.cc
# Opt level: O0

void x25519_ge_tobytes(uint8_t *s,ge_p2 *h)

{
  int iVar1;
  undefined1 local_90 [8];
  fe y;
  fe x;
  fe recip;
  ge_p2 *h_local;
  uint8_t *s_local;
  
  fe_invert((fe *)(x.v + 4),&h->Z);
  fe_mul_ttt((fe *)(y.v + 4),&h->X,(fe *)(x.v + 4));
  fe_mul_ttt((fe *)local_90,&h->Y,(fe *)(x.v + 4));
  fe_tobytes(s,(fe *)local_90);
  iVar1 = fe_isnegative((fe *)(y.v + 4));
  s[0x1f] = s[0x1f] ^ (byte)(iVar1 << 7);
  return;
}

Assistant:

void x25519_ge_tobytes(uint8_t s[32], const ge_p2 *h) {
  fe recip;
  fe x;
  fe y;

  fe_invert(&recip, &h->Z);
  fe_mul_ttt(&x, &h->X, &recip);
  fe_mul_ttt(&y, &h->Y, &recip);
  fe_tobytes(s, &y);
  s[31] ^= fe_isnegative(&x) << 7;
}